

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::ReflectionClassGenerator
          (ReflectionClassGenerator *this,FileDescriptor *file,Options *options)

{
  FileDescriptor *descriptor;
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *descriptor_00;
  string local_50;
  
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,file,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__ReflectionClassGenerator_0041f1e8;
  this->file_ = file;
  (this->namespace_)._M_dataplus._M_p = (pointer)&(this->namespace_).field_2;
  (this->namespace_)._M_string_length = 0;
  (this->namespace_).field_2._M_local_buf[0] = '\0';
  (this->reflectionClassname_)._M_dataplus._M_p = (pointer)&(this->reflectionClassname_).field_2;
  (this->reflectionClassname_)._M_string_length = 0;
  (this->reflectionClassname_).field_2._M_local_buf[0] = '\0';
  GetFileNamespace_abi_cxx11_(&local_50,(csharp *)file,descriptor);
  std::__cxx11::string::operator=((string *)&this->namespace_,(string *)&local_50);
  descriptor_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    descriptor_00 = extraout_RDX_00;
  }
  GetReflectionClassUnqualifiedName_abi_cxx11_(&local_50,(csharp *)file,descriptor_00);
  std::__cxx11::string::operator=((string *)&this->reflectionClassname_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ReflectionClassGenerator::ReflectionClassGenerator(const FileDescriptor* file,
                                                   const Options* options)
    : SourceGeneratorBase(file, options),
      file_(file) {
  namespace_ = GetFileNamespace(file);
  reflectionClassname_ = GetReflectionClassUnqualifiedName(file);
}